

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.c
# Opt level: O0

size_t sp_seg(converter_desc *converter,ucs4_t **inbuf,size_t *inbuf_left,ucs4_t **outbuf,
             size_t *outbuf_left,size_t length)

{
  ucs4_t *puVar1;
  bool bVar2;
  size_t sVar3;
  ucs4_t **ppuVar4;
  ucs4_t **local_f8;
  size_t i_4;
  ucs4_t *puStack_e8;
  int show_delimiter_1;
  ucs4_t *result_3;
  size_t i_3;
  ucs4_t *result_2;
  ucs4_t **match_rs_1;
  size_t match_len_1;
  size_t end;
  size_t begin;
  size_t inbuf_left_start;
  size_t k;
  size_t match_count;
  size_t j;
  size_t i;
  size_t buffer_size_need;
  spseg_buffer_desc *ossb;
  size_t i_2;
  ucs4_t *puStack_68;
  int show_delimiter;
  ucs4_t *result_1;
  size_t i_1;
  ucs4_t *result;
  size_t match_len;
  ucs4_t **match_rs;
  size_t length_local;
  size_t *outbuf_left_local;
  ucs4_t **outbuf_local;
  size_t *inbuf_left_local;
  ucs4_t **inbuf_local;
  converter_desc *converter_local;
  
  match_rs = (ucs4_t **)length;
  length_local = (size_t)outbuf_left;
  outbuf_left_local = (size_t *)outbuf;
  outbuf_local = (ucs4_t **)inbuf_left;
  inbuf_left_local = (size_t *)inbuf;
  inbuf_local = (ucs4_t **)converter;
  if (length == 1) {
    match_len = (size_t)dictionary_group_match_longest
                                  (converter->current_dictionary_group,*inbuf,1,(size_t *)0x0);
    result = (ucs4_t *)0x1;
    if (*(int *)(inbuf_local + 8) == 0) {
      if ((ucs4_t **)match_len == (ucs4_t **)0x0) {
        *(undefined4 *)*outbuf_left_local = *(undefined4 *)*inbuf_left_local;
        *outbuf_left_local = *outbuf_left_local + 4;
        *(long *)length_local = *(long *)length_local + -1;
        *inbuf_left_local = *inbuf_left_local + 4;
        *outbuf_local = (ucs4_t *)((long)*outbuf_local + -1);
      }
      else {
        i_1 = *(size_t *)match_len;
        sVar3 = ucs4len((ucs4_t *)i_1);
        if (*(ulong *)length_local < sVar3) {
          errnum = CONVERTER_ERROR_OUTBUF;
          return 0xffffffffffffffff;
        }
        for (; *(int *)i_1 != 0; i_1 = i_1 + 4) {
          *(undefined4 *)*outbuf_left_local = *(undefined4 *)i_1;
          *outbuf_left_local = *outbuf_left_local + 4;
          *(long *)length_local = *(long *)length_local + -1;
        }
        *inbuf_left_local = (long)result * 4 + *inbuf_left_local;
        *outbuf_local = (ucs4_t *)((long)*outbuf_local - (long)result);
      }
    }
    else if (*(int *)(inbuf_local + 8) == 2) {
      if ((ucs4_t **)match_len == (ucs4_t **)0x0) {
        *(undefined4 *)*outbuf_left_local = *(undefined4 *)*inbuf_left_local;
        *outbuf_left_local = *outbuf_left_local + 4;
        *(long *)length_local = *(long *)length_local + -1;
        *inbuf_left_local = *inbuf_left_local + 4;
        *outbuf_local = (ucs4_t *)((long)*outbuf_local + -1);
      }
      else {
        for (result_1 = (ucs4_t *)0x0; *(long *)(match_len + (long)result_1 * 8) != 0;
            result_1 = (ucs4_t *)((long)result_1 + 1)) {
          puStack_68 = *(ucs4_t **)(match_len + (long)result_1 * 8);
          i_2._4_4_ = (uint)(*(long *)(match_len + 8 + (long)result_1 * 8) != 0);
          sVar3 = ucs4len(puStack_68);
          if (*(ulong *)length_local < sVar3 + (long)(int)i_2._4_4_) {
            errnum = CONVERTER_ERROR_OUTBUF;
            return 0xffffffffffffffff;
          }
          for (; *puStack_68 != 0; puStack_68 = puStack_68 + 1) {
            *(ucs4_t *)*outbuf_left_local = *puStack_68;
            *outbuf_left_local = *outbuf_left_local + 4;
            *(long *)length_local = *(long *)length_local + -1;
          }
          if (i_2._4_4_ != 0) {
            *(undefined4 *)*outbuf_left_local = 0x20;
            *outbuf_left_local = *outbuf_left_local + 4;
            *(long *)length_local = *(long *)length_local + -1;
          }
        }
        *inbuf_left_local = (long)result * 4 + *inbuf_left_local;
        *outbuf_local = (ucs4_t *)((long)*outbuf_local - (long)result);
      }
    }
    else {
      if (*(int *)(inbuf_local + 8) != 1) {
        fprintf(_stderr,"Should not be here %s: %d\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/pkg-ime[P]opencc/src/converter.c"
                ,0xc0);
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/pkg-ime[P]opencc/src/converter.c"
                      ,0xc0,
                      "size_t sp_seg(converter_desc *, ucs4_t **, size_t *, ucs4_t **, size_t *, size_t)"
                     );
      }
      if ((ucs4_t **)match_len == (ucs4_t **)0x0) {
        *(undefined4 *)*outbuf_left_local = *(undefined4 *)*inbuf_left_local;
        *outbuf_left_local = *outbuf_left_local + 4;
        *(long *)length_local = *(long *)length_local + -1;
        *inbuf_left_local = *inbuf_left_local + 4;
        *outbuf_local = (ucs4_t *)((long)*outbuf_local + -1);
      }
      else {
        if (*(ulong *)length_local < 2) {
          errnum = CONVERTER_ERROR_OUTBUF;
          return 0xffffffffffffffff;
        }
        bVar2 = false;
        while (!bVar2) {
          *(undefined4 *)*outbuf_left_local = *(undefined4 *)*inbuf_left_local;
          *outbuf_left_local = *outbuf_left_local + 4;
          *(long *)length_local = *(long *)length_local + -1;
          *inbuf_left_local = *inbuf_left_local + 4;
          *outbuf_local = (ucs4_t *)((long)*outbuf_local + -1);
          bVar2 = true;
        }
      }
      *(undefined4 *)*outbuf_left_local = 0x20;
      *outbuf_left_local = *outbuf_left_local + 4;
      *(long *)length_local = *(long *)length_local + -1;
    }
    converter_local = (converter_desc *)result;
  }
  else {
    i = length + 1;
    buffer_size_need = (size_t)converter;
    if (((converter->spseg_buffer).initialized == 0) || ((converter->spseg_buffer).buffer_size < i))
    {
      sp_seg_set_buffer_size(&converter->spseg_buffer,i);
    }
    for (j = 0; j <= match_rs; j = j + 1) {
      *(undefined8 *)(*(long *)(buffer_size_need + 0x18) + j * 8) = 0x7fffffff;
    }
    **(undefined8 **)(buffer_size_need + 0x20) = 0;
    **(undefined8 **)(buffer_size_need + 0x18) = 0;
    for (j = 0; j < match_rs; j = j + 1) {
      sVar3 = dictionary_group_get_all_match_lengths
                        (inbuf_local[7],(ucs4_t *)(*inbuf_left_local + j * 4),
                         *(size_t **)(buffer_size_need + 0x10));
      k = sVar3;
      if (**(long **)(buffer_size_need + 0x10) != 1) {
        k = sVar3 + 1;
        *(undefined8 *)(*(long *)(buffer_size_need + 0x10) + sVar3 * 8) = 1;
      }
      for (match_count = 0; match_count < k; match_count = match_count + 1) {
        inbuf_left_start = *(ulong *)(*(long *)(buffer_size_need + 0x10) + match_count * 8);
        *(undefined8 *)(*(long *)(buffer_size_need + 0x10) + match_count * 8) = 0;
        if ((inbuf_left_start < 2) ||
           (*(ulong *)(*(long *)(buffer_size_need + 0x18) + (j + inbuf_left_start) * 8) <
            *(long *)(*(long *)(buffer_size_need + 0x18) + j * 8) + 1U)) {
          if ((inbuf_left_start == 1) &&
             (*(long *)(*(long *)(buffer_size_need + 0x18) + j * 8) + 1U <
              *(ulong *)(*(long *)(buffer_size_need + 0x18) + (j + 1) * 8))) {
            *(long *)(*(long *)(buffer_size_need + 0x18) + (j + 1) * 8) =
                 *(long *)(*(long *)(buffer_size_need + 0x18) + j * 8) + 1;
            *(size_t *)(*(long *)(buffer_size_need + 0x20) + (j + 1) * 8) = j;
          }
        }
        else {
          *(long *)(*(long *)(buffer_size_need + 0x18) + (j + inbuf_left_start) * 8) =
               *(long *)(*(long *)(buffer_size_need + 0x18) + j * 8) + 1;
          *(size_t *)(*(long *)(buffer_size_need + 0x20) + (j + inbuf_left_start) * 8) = j;
        }
      }
    }
    j = (size_t)match_rs;
    match_count = *(size_t *)(*(long *)(buffer_size_need + 0x18) + (long)match_rs * 8);
    for (; j != 0; j = *(size_t *)(*(long *)(buffer_size_need + 0x20) + j * 8)) {
      *(size_t *)(*(long *)(buffer_size_need + 0x28) + -8 + match_count * 8) = j;
      match_count = match_count - 1;
    }
    begin = (size_t)*outbuf_local;
    end = 0;
    for (j = 0; j < *(ulong *)(*(long *)(buffer_size_need + 0x18) + (long)match_rs * 8); j = j + 1)
    {
      match_len_1 = *(size_t *)(*(long *)(buffer_size_need + 0x28) + j * 8);
      ppuVar4 = dictionary_group_match_longest
                          (inbuf_local[7],(ucs4_t *)*inbuf_left_local,match_len_1 - end,
                           (size_t *)&match_rs_1);
      if (ppuVar4 == (ucs4_t **)0x0) {
        *(undefined4 *)*outbuf_left_local = *(undefined4 *)*inbuf_left_local;
        *outbuf_left_local = *outbuf_left_local + 4;
        *(long *)length_local = *(long *)length_local + -1;
        *inbuf_left_local = *inbuf_left_local + 4;
        *outbuf_local = (ucs4_t *)((long)*outbuf_local + -1);
      }
      else if (*(int *)(inbuf_local + 8) == 0) {
        if (ppuVar4 == (ucs4_t **)0x0) {
          *(undefined4 *)*outbuf_left_local = *(undefined4 *)*inbuf_left_local;
          *outbuf_left_local = *outbuf_left_local + 4;
          *(long *)length_local = *(long *)length_local + -1;
          *inbuf_left_local = *inbuf_left_local + 4;
          *outbuf_local = (ucs4_t *)((long)*outbuf_local + -1);
        }
        else {
          i_3 = (size_t)*ppuVar4;
          sVar3 = ucs4len((ucs4_t *)i_3);
          if (*(ulong *)length_local < sVar3) {
            if ((ucs4_t *)begin == *outbuf_local) {
              errnum = CONVERTER_ERROR_OUTBUF;
              return 0xffffffffffffffff;
            }
            break;
          }
          for (; *(int *)i_3 != 0; i_3 = i_3 + 4) {
            *(undefined4 *)*outbuf_left_local = *(undefined4 *)i_3;
            *outbuf_left_local = *outbuf_left_local + 4;
            *(long *)length_local = *(long *)length_local + -1;
          }
          *inbuf_left_local = (long)match_rs_1 * 4 + *inbuf_left_local;
          *outbuf_local = (ucs4_t *)((long)*outbuf_local - (long)match_rs_1);
        }
      }
      else if (*(int *)(inbuf_local + 8) == 2) {
        if (ppuVar4 == (ucs4_t **)0x0) {
          *(undefined4 *)*outbuf_left_local = *(undefined4 *)*inbuf_left_local;
          *outbuf_left_local = *outbuf_left_local + 4;
          *(long *)length_local = *(long *)length_local + -1;
          *inbuf_left_local = *inbuf_left_local + 4;
          *outbuf_local = (ucs4_t *)((long)*outbuf_local + -1);
        }
        else {
          for (result_3 = (ucs4_t *)0x0; ppuVar4[(long)result_3] != (ucs4_t *)0x0;
              result_3 = (ucs4_t *)((long)result_3 + 1)) {
            puStack_e8 = ppuVar4[(long)result_3];
            puVar1 = ppuVar4[(long)result_3 + 1];
            sVar3 = ucs4len(puStack_e8);
            if (*(ulong *)length_local < sVar3 + (long)(int)(uint)(puVar1 != (ucs4_t *)0x0)) {
              if ((ucs4_t *)begin == *outbuf_local) {
                errnum = CONVERTER_ERROR_OUTBUF;
                return 0xffffffffffffffff;
              }
              break;
            }
            for (; *puStack_e8 != 0; puStack_e8 = puStack_e8 + 1) {
              *(ucs4_t *)*outbuf_left_local = *puStack_e8;
              *outbuf_left_local = *outbuf_left_local + 4;
              *(long *)length_local = *(long *)length_local + -1;
            }
            if ((puVar1 != (ucs4_t *)0x0) != 0) {
              *(undefined4 *)*outbuf_left_local = 0x20;
              *outbuf_left_local = *outbuf_left_local + 4;
              *(long *)length_local = *(long *)length_local + -1;
            }
          }
          *inbuf_left_local = (long)match_rs_1 * 4 + *inbuf_left_local;
          *outbuf_local = (ucs4_t *)((long)*outbuf_local - (long)match_rs_1);
        }
      }
      else {
        if (*(int *)(inbuf_local + 8) != 1) {
          fprintf(_stderr,"Should not be here %s: %d\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pkg-ime[P]opencc/src/converter.c"
                  ,0x174);
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/pkg-ime[P]opencc/src/converter.c"
                        ,0x174,
                        "size_t sp_seg(converter_desc *, ucs4_t **, size_t *, ucs4_t **, size_t *, size_t)"
                       );
        }
        if (ppuVar4 == (ucs4_t **)0x0) {
          *(undefined4 *)*outbuf_left_local = *(undefined4 *)*inbuf_left_local;
          *outbuf_left_local = *outbuf_left_local + 4;
          *(long *)length_local = *(long *)length_local + -1;
          *inbuf_left_local = *inbuf_left_local + 4;
          *outbuf_local = (ucs4_t *)((long)*outbuf_local + -1);
        }
        else {
          if (*(ulong *)length_local < (long)match_rs_1 + 1U) {
            if ((ucs4_t *)begin == *outbuf_local) {
              errnum = CONVERTER_ERROR_OUTBUF;
              return 0xffffffffffffffff;
            }
            break;
          }
          for (local_f8 = (ucs4_t **)0x0; local_f8 < match_rs_1;
              local_f8 = (ucs4_t **)((long)local_f8 + 1)) {
            *(undefined4 *)*outbuf_left_local = *(undefined4 *)*inbuf_left_local;
            *outbuf_left_local = *outbuf_left_local + 4;
            *(long *)length_local = *(long *)length_local + -1;
            *inbuf_left_local = *inbuf_left_local + 4;
            *outbuf_local = (ucs4_t *)((long)*outbuf_local + -1);
          }
        }
        *(undefined4 *)*outbuf_left_local = 0x20;
        *outbuf_left_local = *outbuf_left_local + 4;
        *(long *)length_local = *(long *)length_local + -1;
      }
      end = match_len_1;
    }
    converter_local = (converter_desc *)(begin - (long)*outbuf_local);
  }
  return (size_t)converter_local;
}

Assistant:

static size_t sp_seg(converter_desc * converter, ucs4_t ** inbuf, size_t * inbuf_left,
		ucs4_t ** outbuf, size_t * outbuf_left, size_t length)
{
	/* 最短路徑分詞 */
	
	/* 對長度爲1時特殊優化 */
	if (length == 1)
	{
		const ucs4_t * const * match_rs = dictionary_group_match_longest(
				converter->current_dictionary_group,
				*inbuf,
				1,
				NULL
		);
		
		size_t match_len = 1;
		if (converter->conversion_mode == OPENCC_CONVERSION_FAST)
		{
			if (match_rs == NULL)
			{
				**outbuf = **inbuf;
				(*outbuf) ++, (*outbuf_left) --;
				(*inbuf) ++, (*inbuf_left) --;
			}
			else
			{
				const ucs4_t * result = match_rs[0];

				/* 輸出緩衝區剩餘空間小於分詞長度 */
				if (ucs4len(result) > *outbuf_left)
				{
					errnum = CONVERTER_ERROR_OUTBUF;
					return (size_t) -1;
				}

				for (; *result; result ++)
				{
					**outbuf = *result;
					(*outbuf) ++,(*outbuf_left) --;
				}

				*inbuf += match_len;
				*inbuf_left -= match_len;
			}
		}
		else if (converter->conversion_mode == OPENCC_CONVERSION_LIST_CANDIDATES)
		{
			if (match_rs == NULL)
			{
				**outbuf = **inbuf;
				(*outbuf) ++, (*outbuf_left) --;
				(*inbuf) ++, (*inbuf_left) --;
			}
			else
			{
				size_t i;
				for (i = 0; match_rs[i] != NULL; i ++)
				{
					const ucs4_t * result = match_rs[i];
					int show_delimiter = match_rs[i + 1] != NULL ? 1 : 0;

					/* 輸出緩衝區剩餘空間小於分詞長度 */
					if (ucs4len(result) + show_delimiter > *outbuf_left)
					{
						errnum = CONVERTER_ERROR_OUTBUF;
						return (size_t) -1;
					}

					for (; *result; result ++)
					{
						**outbuf = *result;
						(*outbuf) ++,(*outbuf_left) --;
					}

					if (show_delimiter)
					{
						**outbuf = DELIMITER;
						(*outbuf) ++, (*outbuf_left) --;
					}
				}
				*inbuf += match_len;
				*inbuf_left -= match_len;
			}
		}
		else if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY)
		{
			if (match_rs == NULL)
			{
				**outbuf = **inbuf;
				(*outbuf) ++, (*outbuf_left) --;
				(*inbuf) ++, (*inbuf_left) --;
			}
			else
			{
				/* 輸出緩衝區剩餘空間小於分詞長度 */
				if (match_len + 1 > *outbuf_left)
				{
					errnum = CONVERTER_ERROR_OUTBUF;
					return (size_t) -1;
				}

				size_t i;
				for (i = 0; i < match_len; i ++)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
			}
			**outbuf = DELIMITER;
			(*outbuf) ++, (*outbuf_left) --;
		}
		else
			debug_should_not_be_here();
		/* 必須保證有一個字符空間 */
		return match_len;
	}
	
	/* 設置緩衝區空間 */
	spseg_buffer_desc * ossb = &(converter->spseg_buffer);
	size_t buffer_size_need = length + 1;
	if (ossb->initialized == FALSE || ossb->buffer_size < buffer_size_need)
		sp_seg_set_buffer_size(&(converter->spseg_buffer), buffer_size_need);
	
	size_t i, j;

	for (i = 0; i <= length; i ++)
		ossb->min_len[i] = INFINITY_INT;
	
	ossb->min_len[0] = ossb->parent[0] = 0;
	
	for (i = 0; i < length; i ++)
	{
		/* 獲取所有匹配長度 */
		size_t match_count = dictionary_group_get_all_match_lengths(
				converter->current_dictionary_group,
				(*inbuf) + i,
				ossb->match_length
		);
		
		if (ossb->match_length[0] != 1)
			ossb->match_length[match_count ++] = 1;
		
		/* 動態規劃求最短分割路徑 */
		for (j = 0; j < match_count; j ++)
		{
			size_t k = ossb->match_length[j];
			ossb->match_length[j] = 0;
			
			if (k > 1 && ossb->min_len[i] + 1 <= ossb->min_len[i + k])
			{
				ossb->min_len[i + k] = ossb->min_len[i] + 1;
				ossb->parent[i + k] = i;
			}
			else if (k == 1 && ossb->min_len[i] + 1 < ossb->min_len[i + k])
			{
				ossb->min_len[i + k] = ossb->min_len[i] + 1;
				ossb->parent[i + k] = i;
			}
		}
	}
	
	/* 取得最短分割路徑 */
	for (i = length, j = ossb->min_len[length]; i != 0; i = ossb->parent[i])
		ossb->path[--j] = i;
	
	size_t inbuf_left_start = *inbuf_left;
	size_t begin, end;

	/* 根據最短分割路徑轉換 */
	for (i = begin = 0; i < ossb->min_len[length]; i ++)
	{
		end = ossb->path[i];
		
		size_t match_len;
		const ucs4_t * const * match_rs = dictionary_group_match_longest(
				converter->current_dictionary_group,
				*inbuf,
				end - begin,
				&match_len
		);

		if (match_rs == NULL)
		{
			**outbuf = **inbuf;
			(*outbuf) ++, (*outbuf_left) --;
			(*inbuf) ++, (*inbuf_left) --;
		}
		else
		{
			if (converter->conversion_mode == OPENCC_CONVERSION_FAST)
			{
				if (match_rs == NULL)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
				else
				{
					const ucs4_t * result = match_rs[0];

					/* 輸出緩衝區剩餘空間小於分詞長度 */
					if (ucs4len(result) > *outbuf_left)
					{
						if (inbuf_left_start - *inbuf_left > 0)
							break;
						errnum = CONVERTER_ERROR_OUTBUF;
						return (size_t) -1;
					}

					for (; *result; result ++)
					{
						**outbuf = *result;
						(*outbuf) ++,(*outbuf_left) --;
					}

					*inbuf += match_len;
					*inbuf_left -= match_len;
				}
			}
			else if (converter->conversion_mode == OPENCC_CONVERSION_LIST_CANDIDATES)
			{
				if (match_rs == NULL)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
				else
				{
					size_t i;
					for (i = 0; match_rs[i] != NULL; i ++)
					{
						const ucs4_t * result = match_rs[i];
						int show_delimiter = match_rs[i + 1] != NULL ? 1 : 0;

						/* 輸出緩衝區剩餘空間小於分詞長度 */
						if (ucs4len(result) + show_delimiter > *outbuf_left)
						{
							if (inbuf_left_start - *inbuf_left > 0)
								break;
							errnum = CONVERTER_ERROR_OUTBUF;
							return (size_t) -1;
						}

						for (; *result; result ++)
						{
							**outbuf = *result;
							(*outbuf) ++,(*outbuf_left) --;
						}

						if (show_delimiter)
						{
							**outbuf = DELIMITER;
							(*outbuf) ++, (*outbuf_left) --;
						}
					}
					*inbuf += match_len;
					*inbuf_left -= match_len;
				}
			}
			else if (converter->conversion_mode == OPENCC_CONVERSION_SEGMENT_ONLY)
			{
				if (match_rs == NULL)
				{
					**outbuf = **inbuf;
					(*outbuf) ++, (*outbuf_left) --;
					(*inbuf) ++, (*inbuf_left) --;
				}
				else
				{
					/* 輸出緩衝區剩餘空間小於分詞長度 */
					if (match_len + 1 > *outbuf_left)
					{
						if (inbuf_left_start - *inbuf_left > 0)
							break;
						errnum = CONVERTER_ERROR_OUTBUF;
						return (size_t) -1;
					}

					size_t i;
					for (i = 0; i < match_len; i ++)
					{
						**outbuf = **inbuf;
						(*outbuf) ++, (*outbuf_left) --;
						(*inbuf) ++, (*inbuf_left) --;
					}
				}
				**outbuf = DELIMITER;
				(*outbuf) ++, (*outbuf_left) --;
			}
			else
				debug_should_not_be_here();
		}
		
		begin = end;
	}
	
	return inbuf_left_start - *inbuf_left;
}